

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall leveldb::VersionSet::Builder::~Builder(Builder *this)

{
  int iVar1;
  _Rb_tree<leveldb::FileMetaData_*,_leveldb::FileMetaData_*,_std::_Identity<leveldb::FileMetaData_*>,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
  *this_00;
  FileMetaData *pFVar2;
  pointer pcVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  LevelState *this_01;
  int level;
  long lVar7;
  ulong uVar8;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> to_unref;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> local_58;
  LevelState *local_38;
  
  local_38 = this->levels_;
  lVar7 = 0;
  do {
    this_00 = &(local_38[lVar7].added_files)->_M_t;
    local_58.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (FileMetaData **)0x0;
    local_58.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (FileMetaData **)0x0;
    local_58.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (FileMetaData **)0x0;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              (&local_58,(this_00->_M_impl).super__Rb_tree_header._M_node_count);
    for (p_Var5 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this_00->_M_impl).super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      if (local_58.
          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_58.
          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
        _M_realloc_insert<leveldb::FileMetaData*const&>
                  ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
                   &local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(FileMetaData **)(p_Var5 + 1));
      }
      else {
        *local_58.
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish = *(FileMetaData **)(p_Var5 + 1);
        local_58.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_58.
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    std::
    _Rb_tree<leveldb::FileMetaData_*,_leveldb::FileMetaData_*,_std::_Identity<leveldb::FileMetaData_*>,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::_M_erase(this_00,(_Link_type)(this_00->_M_impl).super__Rb_tree_header._M_header._M_parent);
    operator_delete(this_00);
    if (local_58.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_58.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar6 = 0;
      uVar8 = 1;
      do {
        pFVar2 = local_58.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6];
        iVar1 = pFVar2->refs;
        pFVar2->refs = iVar1 + -1;
        if (iVar1 < 2) {
          pcVar3 = (pFVar2->largest).rep_._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != &(pFVar2->largest).rep_.field_2) {
            operator_delete(pcVar3);
          }
          pcVar3 = (pFVar2->smallest).rep_._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != &(pFVar2->smallest).rep_.field_2) {
            operator_delete(pcVar3);
          }
          operator_delete(pFVar2);
        }
        bVar4 = uVar8 < (ulong)((long)local_58.
                                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_58.
                                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar6 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar4);
    }
    if (local_58.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (FileMetaData **)0x0) {
      operator_delete(local_58.
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 7);
  Version::Unref(this->base_);
  this_01 = this->levels_ + 6;
  lVar7 = -0x188;
  do {
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_erase((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                *)this_01,
               (_Link_type)
               (this_01->deleted_files)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    this_01 = this_01 + -1;
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0);
  return;
}

Assistant:

~Builder() {
    for (int level = 0; level < config::kNumLevels; level++) {
      const FileSet* added = levels_[level].added_files;
      std::vector<FileMetaData*> to_unref;
      to_unref.reserve(added->size());
      for (FileSet::const_iterator it = added->begin(); it != added->end();
           ++it) {
        to_unref.push_back(*it);
      }
      delete added;
      for (uint32_t i = 0; i < to_unref.size(); i++) {
        FileMetaData* f = to_unref[i];
        f->refs--;
        if (f->refs <= 0) {
          delete f;
        }
      }
    }
    base_->Unref();
  }